

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsInfinite<Imath_2_5::Vec2<short>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  short *psVar5;
  char *in_RDI;
  Box<Imath_2_5::Vec2<short>_> b_1;
  Vec2<short> max;
  Vec2<short> min;
  Box<Imath_2_5::Vec2<short>_> b1;
  uint i;
  Vec2<short> p1;
  Vec2<short> p0;
  Box<Imath_2_5::Vec2<short>_> b0;
  Box<Imath_2_5::Vec2<short>_> b;
  undefined4 in_stack_ffffffffffffffb0;
  short in_stack_ffffffffffffffb4;
  short in_stack_ffffffffffffffb6;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Box<Imath_2_5::Vec2<short>_> *in_stack_ffffffffffffffc0;
  Box<Imath_2_5::Vec2<short>_> *in_stack_ffffffffffffffc8;
  uint local_2c;
  Vec2<short> local_28;
  Vec2<short> local_24;
  Vec2<short> local_20;
  Vec2<short> local_1c [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    isInfinite() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec2<short>_>::Box
            ((Box<Imath_2_5::Vec2<short>_> *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)));
  Imath_2_5::Box<Imath_2_5::Vec2<short>_>::makeInfinite
            ((Box<Imath_2_5::Vec2<short>_> *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<short>_>::isInfinite(in_stack_ffffffffffffffc8);
  if (!bVar1) {
    __assert_fail("b.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,799,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec2<short>]"
                 );
  }
  Imath_2_5::Vec2<short>::Vec2(local_1c,-1);
  Imath_2_5::Vec2<short>::Vec2(&local_20,1);
  Imath_2_5::Box<Imath_2_5::Vec2<short>_>::Box
            (in_stack_ffffffffffffffc0,
             (Vec2<short> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (Vec2<short> *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<short>_>::isInfinite(in_stack_ffffffffffffffc8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x32a,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec2<short>]"
                 );
  }
  Imath_2_5::Vec2<short>::Vec2(&local_24);
  Imath_2_5::Vec2<short>::Vec2(&local_28);
  local_2c = 0;
  while( true ) {
    uVar3 = local_2c;
    uVar2 = Imath_2_5::Vec2<short>::dimensions();
    if (uVar2 <= uVar3) break;
    in_stack_ffffffffffffffb4 = -(short)(1 << ((char)local_2c + 1U & 0x1f));
    psVar5 = Imath_2_5::Vec2<short>::operator[](&local_24,local_2c);
    *psVar5 = in_stack_ffffffffffffffb4;
    uVar3 = Imath_2_5::Vec2<short>::dimensions();
    in_stack_ffffffffffffffb6 = (short)(1 << ((char)uVar3 - (char)local_2c & 0x1fU));
    psVar5 = Imath_2_5::Vec2<short>::operator[](&local_28,local_2c);
    *psVar5 = in_stack_ffffffffffffffb6;
    local_2c = local_2c + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec2<short>_>::Box
            (in_stack_ffffffffffffffc0,(Vec2<short> *)CONCAT44(in_stack_ffffffffffffffbc,uVar3),
             (Vec2<short> *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<short>_>::isInfinite(in_stack_ffffffffffffffc8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x334,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec2<short>]"
                 );
  }
  Imath_2_5::Vec2<short>::Vec2((Vec2<short> *)&stack0xffffffffffffffc8,0);
  Imath_2_5::Vec2<short>::Vec2
            ((Vec2<short> *)&stack0xffffffffffffffc4,(Vec2<short> *)&stack0xffffffffffffffc8);
  uVar2 = Imath_2_5::Vec2<short>::dimensions();
  psVar5 = Imath_2_5::Vec2<short>::operator[]((Vec2<short> *)&stack0xffffffffffffffc4,uVar2 - 1);
  *psVar5 = 2;
  Imath_2_5::Box<Imath_2_5::Vec2<short>_>::Box
            (in_stack_ffffffffffffffc0,(Vec2<short> *)CONCAT44(in_stack_ffffffffffffffbc,uVar3),
             (Vec2<short> *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<short>_>::isInfinite(in_stack_ffffffffffffffc8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x345,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec2<short>]"
                 );
  }
  return;
}

Assistant:

void
testIsInfinite(const char *type)
{
    cout << "    isInfinite() for type " << type << endl;

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite();
        assert(b.isInfinite());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(!b0.isInfinite());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            p0[i] = -typename T::BaseType(1 << (i + 1));
            p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(!b1.isInfinite());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.isInfinite());
    }
}